

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool tinyxml2::XMLUtil::ToInt64(char *str,int64_t *value)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long_long v;
  
  bVar1 = *str;
  pcVar3 = str;
  while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
    bVar1 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
  }
  if ((*pcVar3 == '0') && ((pcVar3[1] & 0xdfU) == 0x58)) {
    pcVar3 = "%llx";
  }
  else {
    pcVar3 = "%lld";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3);
  if (iVar2 == 1) {
    *value = 0;
  }
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToInt64(const char* str, int64_t* value)
{
    if (IsPrefixHex(str)) {
        unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llx
        if (TIXML_SSCANF(str, "%llx", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
    else {
        long long v = 0;	// horrible syntax trick to make the compiler happy about %lld
        if (TIXML_SSCANF(str, "%lld", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
	return false;
}